

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberType(CppTypeName *this,StringPtr innerName)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  ArrayPtr<const_char> *in_R8;
  StringTree local_68;
  ArrayPtr<const_char> local_30;
  char *local_20;
  char *local_18;
  
  local_30.ptr = innerName.content.ptr;
  local_20 = "::";
  local_18 = (char *)0x2;
  local_30.size_ = innerName.content.size_ - 1;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (&local_68,&this->name,(StringTree *)&stack0xffffffffffffffe0,&local_30,in_R8);
  (this->name).size_ = local_68.size_;
  pcVar1 = (this->name).text.content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->name).text.content.size_;
    (this->name).text.content.ptr = (char *)0x0;
    (this->name).text.content.size_ = 0;
    pAVar3 = (this->name).text.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  (this->name).text.content.ptr = local_68.text.content.ptr;
  (this->name).text.content.size_ = local_68.text.content.size_;
  (this->name).text.content.disposer = local_68.text.content.disposer;
  local_68.text.content.ptr = (char *)0x0;
  local_68.text.content.size_ = 0;
  pBVar4 = (this->name).branches.ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = (this->name).branches.size_;
    (this->name).branches.ptr = (Branch *)0x0;
    (this->name).branches.size_ = 0;
    pAVar3 = (this->name).branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_68.text.content.size_;
  pcVar1 = local_68.text.content.ptr;
  (this->name).branches.ptr = local_68.branches.ptr;
  (this->name).branches.size_ = local_68.branches.size_;
  (this->name).branches.disposer = local_68.branches.disposer;
  local_68.branches.ptr = (Branch *)0x0;
  local_68.branches.size_ = 0;
  if (local_68.text.content.ptr != (char *)0x0) {
    local_68.text.content.ptr = (char *)0x0;
    local_68.text.content.size_ = 0;
    (**(local_68.text.content.disposer)->_vptr_ArrayDisposer)
              (local_68.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  this->needsTypename = this->isArgDependent;
  return;
}

Assistant:

void addMemberType(kj::StringPtr innerName) {
    // Append "::innerName" to refer to a member.

    name = kj::strTree(kj::mv(name), "::", innerName);
    needsTypename = isArgDependent;
  }